

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TZGNCore::getPartialLocationName
          (TZGNCore *this,UnicodeString *tzCanonicalID,UnicodeString *mzID,UBool isLong,
          UnicodeString *mzDisplayName,UnicodeString *name)

{
  UChar *this_00;
  UBool UVar1;
  ConstChar16Ptr local_58;
  TZGNCore *local_50;
  TZGNCore *nonConstThis;
  UChar *uplname;
  UnicodeString *name_local;
  UnicodeString *mzDisplayName_local;
  UnicodeString *pUStack_28;
  UBool isLong_local;
  UnicodeString *mzID_local;
  UnicodeString *tzCanonicalID_local;
  TZGNCore *this_local;
  
  uplname = (UChar *)name;
  name_local = mzDisplayName;
  mzDisplayName_local._7_1_ = isLong;
  pUStack_28 = mzID;
  mzID_local = tzCanonicalID;
  tzCanonicalID_local = (UnicodeString *)this;
  UnicodeString::setToBogus(name);
  UVar1 = UnicodeString::isEmpty(mzID_local);
  if (((UVar1 == '\0') && (UVar1 = UnicodeString::isEmpty(pUStack_28), UVar1 == '\0')) &&
     (UVar1 = UnicodeString::isEmpty(name_local), UVar1 == '\0')) {
    nonConstThis = (TZGNCore *)0x0;
    local_50 = this;
    umtx_lock_63((UMutex *)gLock);
    nonConstThis = (TZGNCore *)
                   getPartialLocationName
                             (local_50,mzID_local,pUStack_28,mzDisplayName_local._7_1_,name_local);
    umtx_unlock_63((UMutex *)gLock);
    this_00 = uplname;
    if (nonConstThis == (TZGNCore *)0x0) {
      UnicodeString::setToBogus((UnicodeString *)uplname);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_58,(char16_t *)nonConstThis);
      UnicodeString::setTo((UnicodeString *)this_00,'\x01',&local_58,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_58);
    }
    return (UnicodeString *)uplname;
  }
  return (UnicodeString *)uplname;
}

Assistant:

UnicodeString&
TZGNCore::getPartialLocationName(const UnicodeString& tzCanonicalID,
                        const UnicodeString& mzID, UBool isLong, const UnicodeString& mzDisplayName,
                        UnicodeString& name) const {
    name.setToBogus();
    if (tzCanonicalID.isEmpty() || mzID.isEmpty() || mzDisplayName.isEmpty()) {
        return name;
    }

    const UChar *uplname = NULL;
    TZGNCore *nonConstThis = const_cast<TZGNCore *>(this);
    umtx_lock(&gLock);
    {
        uplname = nonConstThis->getPartialLocationName(tzCanonicalID, mzID, isLong, mzDisplayName);
    }
    umtx_unlock(&gLock);

    if (uplname == NULL) {
        name.setToBogus();
    } else {
        name.setTo(TRUE, uplname, -1);
    }
    return name;
}